

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-common.hpp
# Opt level: O3

void baryonyx::itm::
     init_with_bastert<baryonyx::itm::quadratic_cost_type<double>,baryonyx::itm::minimize_tag>
               (bit_array *x,quadratic_cost_type<double> *c,int variables,int value_if_0)

{
  int iVar1;
  int *piVar2;
  quad *pqVar3;
  int iVar4;
  ulong uVar5;
  double dVar6;
  
  if (variables != 0) {
    uVar5 = 0;
    do {
      piVar2 = (c->indices)._M_t.super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
               super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
               super__Head_base<0UL,_int_*,_false>._M_head_impl;
      dVar6 = (c->linear_elements)._M_t.
              super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
              super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
              super__Head_base<0UL,_double_*,_false>._M_head_impl[uVar5];
      iVar1 = piVar2[uVar5];
      iVar4 = piVar2[uVar5 + 1];
      if (iVar4 != iVar1) {
        iVar4 = iVar4 - iVar1;
        pqVar3 = (c->quadratic_elements)._M_t.
                 super___uniq_ptr_impl<baryonyx::itm::quadratic_cost_type<double>::quad,_std::default_delete<baryonyx::itm::quadratic_cost_type<double>::quad[]>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_baryonyx::itm::quadratic_cost_type<double>::quad_*,_std::default_delete<baryonyx::itm::quadratic_cost_type<double>::quad[]>_>
                 .super__Head_base<0UL,_baryonyx::itm::quadratic_cost_type<double>::quad_*,_false>.
                 _M_head_impl + iVar1;
        do {
          dVar6 = dVar6 + pqVar3->factor;
          pqVar3 = pqVar3 + 1;
          iVar4 = iVar4 + -1;
        } while (iVar4 != 0);
      }
      if ((dVar6 < 0.0) || (value_if_0 != 0 && dVar6 == 0.0)) {
        bit_array_impl::set(&x->super_bit_array_impl,(int)uVar5);
      }
      else {
        bit_array_impl::unset(&x->super_bit_array_impl,(int)uVar5);
      }
      uVar5 = uVar5 + 1;
    } while (uVar5 != (uint)variables);
  }
  return;
}

Assistant:

void
init_with_bastert(bit_array& x,
                  const Cost& c,
                  const int variables,
                  const int value_if_0) noexcept
{
    for (int i = 0; i != variables; ++i)
        if (init_x<Mode>(c[i], value_if_0))
            x.set(i);
        else
            x.unset(i);
}